

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  int new_height;
  int new_width;
  bool bVar4;
  uint uVar5;
  void *__ptr;
  ulong uVar6;
  void *pvVar7;
  byte bVar8;
  color_quad<unsigned_char,_int> *pcVar9;
  long lVar10;
  uchar uVar11;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  int iVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  int in_stack_fffffffffffffeb8;
  int y;
  int x;
  int n;
  uint8_vec buf;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_120;
  int local_11c [3];
  stbi__context local_110;
  
  buf.m_p = (uchar *)0x0;
  buf.m_size = 0;
  buf.m_capacity = 0;
  bVar4 = data_stream_serializer::read_entire_file(serializer,&buf);
  if (bVar4) {
    x = 0;
    y = 0;
    n = 0;
    local_110.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
    local_110.read_from_callbacks = 0;
    local_110.callback_already_read = 0;
    local_110.img_buffer_original = buf.m_p;
    local_110.img_buffer = buf.m_p;
    local_110.img_buffer_end = buf.m_p + (int)buf.m_size;
    local_110.img_buffer_original_end = local_110.img_buffer_end;
    __ptr = stbi__load_main(&local_110,&x,&y,&n,(int)local_11c,
                            (stbi__result_info *)CONCAT71(in_register_00000089,in_R9B),
                            in_stack_fffffffffffffeb8);
    new_width = x;
    new_height = y;
    if (__ptr != (void *)0x0) {
      if (local_11c[0] == 0x10) {
        iVar12 = x * y;
        uVar5 = iVar12 * 4;
        pvVar7 = malloc((long)(int)uVar5);
        if (pvVar7 == (void *)0x0) {
          *(char **)(in_FS_OFFSET + -8) = "outofmem";
          goto LAB_00115469;
        }
        uVar6 = 0;
        uVar13 = (ulong)uVar5;
        if (iVar12 * 4 < 1) {
          uVar13 = uVar6;
        }
        for (; uVar13 != uVar6; uVar6 = uVar6 + 1) {
          *(undefined1 *)((long)pvVar7 + uVar6) = *(undefined1 *)((long)__ptr + uVar6 * 2 + 1);
        }
        free(__ptr);
        __ptr = pvVar7;
      }
      else if (local_11c[0] != 8) {
        __assert_fail("ri.bits_per_channel == 8 || ri.bits_per_channel == 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/stb/stb_image.h"
                      ,0x4b9,
                      "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
      iVar12 = n;
      if (new_height < 0x4001 && new_width < 0x4001) {
        local_120.m_u32 = 0xff000000;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (img,new_width,new_height,0xffffffff,
                   (color_quad<unsigned_char,_int> *)&local_120.field_0);
        uVar6 = 0;
        uVar13 = (ulong)(uint)new_height;
        if (new_height < 1) {
          uVar13 = uVar6;
        }
        bVar8 = 1;
        pvVar7 = __ptr;
        for (; uVar6 != uVar13; uVar6 = uVar6 + 1) {
          pcVar9 = img->m_pPixels + img->m_pitch * (int)uVar6;
          for (lVar10 = 0; (long)new_width * 4 != lVar10; lVar10 = lVar10 + 4) {
            uVar11 = *(uchar *)((long)pvVar7 + lVar10 + 3);
            if ((iVar12 != 2) && (iVar12 != 4)) {
              uVar11 = 0xff;
            }
            uVar1 = *(uchar *)((long)pvVar7 + lVar10);
            uVar2 = *(uchar *)((long)pvVar7 + lVar10 + 1);
            uVar3 = *(uchar *)((long)pvVar7 + lVar10 + 2);
            (pcVar9->field_0).field_0.r = uVar1;
            (pcVar9->field_0).field_0.g = uVar2;
            bVar8 = bVar8 & (uVar2 == uVar3 && uVar1 == uVar2);
            (pcVar9->field_0).field_0.b = uVar3;
            (pcVar9->field_0).field_0.a = uVar11;
            pcVar9 = pcVar9 + 1;
          }
          pvVar7 = (void *)((long)pvVar7 + (long)new_width * 4);
        }
        free(__ptr);
        uVar5 = (uint)bVar8 << 4 | 0xf;
        img->m_comp_flags = uVar5;
        if ((iVar12 != 2) && (iVar12 != 4)) {
          uVar5 = (uint)bVar8 << 4 | 7;
        }
        img->m_comp_flags = uVar5;
        bVar4 = true;
        goto LAB_0011546b;
      }
      free(__ptr);
    }
  }
LAB_00115469:
  bVar4 = false;
LAB_0011546b:
  vector<unsigned_char>::~vector(&buf);
  return bVar4;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img)
        {
            uint8_vec buf;
            if (!serializer.read_entire_file(buf))
            {
                return false;
            }

            int x = 0, y = 0, n = 0;
            unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

            if (!pData)
            {
                return false;
            }

            if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION))
            {
                stbi_image_free(pData);
                return false;
            }

            const bool has_alpha = ((n == 2) || (n == 4));

            img.resize(x, y);

            bool grayscale = true;

            for (int py = 0; py < y; py++)
            {
                const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
                color_quad_u8* pDst = img.get_scanline(py);
                color_quad_u8* pDst_end = pDst + x;

                while (pDst != pDst_end)
                {
                    color_quad_u8 c(*pSrc++);
                    if (!has_alpha)
                    {
                        c.a = 255;
                    }

                    if (!c.is_grayscale())
                    {
                        grayscale = false;
                    }

                    *pDst++ = c;
                }
            }

            stbi_image_free(pData);

            img.reset_comp_flags();
            img.set_grayscale(grayscale);
            img.set_component_valid(3, has_alpha);

            return true;
        }